

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcWallStandardCase::IfcWallStandardCase(IfcWallStandardCase *this)

{
  *(undefined ***)&(this->super_IfcWall).field_0x168 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x170 = 0;
  *(char **)&this->field_0x178 = "IfcWallStandardCase";
  IfcWall::IfcWall(&this->super_IfcWall,&PTR_construction_vtable_24__008b55d0);
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
       = 0x8b5478;
  *(undefined8 *)&(this->super_IfcWall).field_0x168 = 0x8b55b8;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
    .field_0x88 = 0x8b54a0;
  (this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b54c8;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
    .field_0xd0 = 0x8b54f0;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 =
       0x8b5518;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.field_0x138 =
       0x8b5540;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.field_0x148 =
       0x8b5568;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.field_0x158 = 0x8b5590;
  return;
}

Assistant:

IfcWallStandardCase() : Object("IfcWallStandardCase") {}